

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O1

void tcu::astc::anon_unknown_0::encodeISE
               (BitAssignAccessStream *dst,ISEParams *params,ISEInput *input,int numValues)

{
  undefined8 *puVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  anon_union_1536_2_f6fb8abe_for_value *paVar6;
  uint *puVar7;
  long lVar8;
  ISEInput *pIVar9;
  int numBits;
  long lVar10;
  long lVar11;
  ulong uVar12;
  anon_union_1536_2_f6fb8abe_for_value *paVar13;
  deUint32 bitParts [3];
  deUint32 quintParts [3];
  deUint32 local_a8 [8];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  uint local_68 [8];
  long local_48;
  ulong local_40;
  ulong local_38;
  
  if (params->mode == ISEMODE_TRIT) {
    uVar4 = (uint)(0x33333332 < numValues * -0x33333333 + 0x19999999U);
    uVar5 = uVar4 + numValues / 5;
    if (uVar5 != 0 && SCARRY4(uVar4,numValues / 5) == (int)uVar5 < 0) {
      local_38 = (ulong)(uVar5 - 1);
      local_40 = (ulong)uVar5;
      local_48 = (long)(int)(numValues + (uVar5 - 1) * -5);
      uVar12 = 0;
      do {
        bVar2 = input->isGivenInBlockForm;
        if (bVar2 == true) {
          local_78 = *(undefined8 *)((long)&input->value + uVar12 * 0x18 + 0x10);
          puVar1 = (undefined8 *)((long)&input->value + uVar12 * 0x18);
          local_88 = *puVar1;
          uStack_80 = puVar1[1];
        }
        else {
          local_88 = 0;
          uStack_80 = 0;
          local_78 = 0;
        }
        iVar3 = params->numBits;
        lVar8 = (long)&input->value + ((long)((uVar12 << 0x20) * 5) >> 0x1e);
        if (bVar2 != false) {
          lVar8 = 0;
        }
        uVar5 = ~(-1 << ((byte)iVar3 & 0x1f));
        if (0x1f < iVar3) {
          uVar5 = 0xffffffff;
        }
        lVar10 = 5;
        if (uVar12 == local_38) {
          lVar10 = local_48;
        }
        lVar11 = 0;
        do {
          if (lVar11 < lVar10) {
            if (bVar2 == false) {
              if (iVar3 < 1) {
                uVar4 = 0;
              }
              else {
                uVar4 = *(uint *)(lVar8 + lVar11 * 4) & uVar5;
              }
              local_a8[lVar11] = uVar4;
              uVar4 = *(uint *)(lVar8 + lVar11 * 4) >> ((byte)iVar3 & 0x1f);
            }
            else {
              local_a8[lVar11] = *(deUint32 *)((long)&local_88 + lVar11 * 4 + 4);
              uVar4 = 0xffffffff;
            }
          }
          else {
            local_a8[lVar11] = 0;
            uVar4 = 0;
          }
          local_68[lVar11] = uVar4;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 5);
        puVar7 = (uint *)&local_88;
        if (bVar2 == false) {
          puVar7 = (uint *)((anonymous_namespace)::
                            encodeISETritBlock(tcu::astc::(anonymous_namespace)::BitAssignAccessStream&,int,bool,tcu::astc::(anonymous_namespace)::ISEInput::Block_const&,unsigned_int_const*,int)
                            ::tritBlockTValue +
                           (ulong)local_68[4] * 4 +
                           (ulong)local_68[3] * 0xc +
                           (ulong)local_68[2] * 0x24 +
                           (ulong)local_68[1] * 0x6c + (ulong)local_68[0] * 0x144);
        }
        uVar5 = *puVar7;
        BitAssignAccessStream::setNext(dst,iVar3,local_a8[0]);
        BitAssignAccessStream::setNext(dst,2,uVar5 & 3);
        BitAssignAccessStream::setNext(dst,iVar3,local_a8[1]);
        BitAssignAccessStream::setNext(dst,2,uVar5 >> 2 & 3);
        BitAssignAccessStream::setNext(dst,iVar3,local_a8[2]);
        BitAssignAccessStream::setNext(dst,1,uVar5 >> 4 & 1);
        BitAssignAccessStream::setNext(dst,iVar3,local_a8[3]);
        BitAssignAccessStream::setNext(dst,2,uVar5 >> 5 & 3);
        BitAssignAccessStream::setNext(dst,iVar3,local_a8[4]);
        BitAssignAccessStream::setNext(dst,1,uVar5 >> 7 & 1);
        uVar12 = uVar12 + 1;
      } while (uVar12 != local_40);
    }
  }
  else if (params->mode == ISEMODE_QUINT) {
    uVar5 = (uint)(0x55555554 < numValues * -0x55555555 + 0x2aaaaaaaU);
    uVar4 = uVar5 + numValues / 3;
    if (uVar4 != 0 && SCARRY4(uVar5,numValues / 3) == (int)uVar4 < 0) {
      local_38 = (ulong)(uVar4 - 1);
      local_40 = (ulong)uVar4;
      local_48 = (long)(int)(numValues + (uVar4 - 1) * -3);
      uVar12 = 0;
      do {
        bVar2 = input->isGivenInBlockForm;
        if (bVar2 == true) {
          local_78 = *(undefined8 *)((long)&input->value + uVar12 * 0x18 + 0x10);
          puVar1 = (undefined8 *)((long)&input->value + uVar12 * 0x18);
          local_88 = *puVar1;
          uStack_80 = puVar1[1];
        }
        else {
          local_88 = 0;
          uStack_80 = 0;
          local_78 = 0;
        }
        iVar3 = params->numBits;
        lVar8 = (long)&input->value + ((long)((uVar12 << 0x20) * 3) >> 0x1e);
        if (bVar2 != false) {
          lVar8 = 0;
        }
        uVar5 = ~(-1 << ((byte)iVar3 & 0x1f));
        if (0x1f < iVar3) {
          uVar5 = 0xffffffff;
        }
        lVar10 = 3;
        if (uVar12 == local_38) {
          lVar10 = local_48;
        }
        lVar11 = 0;
        do {
          if (lVar11 < lVar10) {
            if (bVar2 == false) {
              if (iVar3 < 1) {
                uVar4 = 0;
              }
              else {
                uVar4 = *(uint *)(lVar8 + lVar11 * 4) & uVar5;
              }
              local_a8[lVar11] = uVar4;
              uVar4 = *(uint *)(lVar8 + lVar11 * 4) >> ((byte)iVar3 & 0x1f);
            }
            else {
              local_a8[lVar11] = *(deUint32 *)((long)&local_88 + lVar11 * 4 + 4);
              uVar4 = 0xffffffff;
            }
          }
          else {
            local_a8[lVar11] = 0;
            uVar4 = 0;
          }
          local_68[lVar11] = uVar4;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 3);
        puVar7 = (uint *)((anonymous_namespace)::
                          encodeISEQuintBlock(tcu::astc::(anonymous_namespace)::BitAssignAccessStream&,int,bool,tcu::astc::(anonymous_namespace)::ISEInput::Block_const&,unsigned_int_const*,int)
                          ::quintBlockQValue +
                         (ulong)local_68[2] * 4 +
                         (ulong)local_68[1] * 0x14 + (ulong)local_68[0] * 100);
        if (bVar2 != false) {
          puVar7 = (uint *)&local_88;
        }
        uVar5 = *puVar7;
        BitAssignAccessStream::setNext(dst,iVar3,local_a8[0]);
        BitAssignAccessStream::setNext(dst,3,uVar5 & 7);
        BitAssignAccessStream::setNext(dst,iVar3,local_a8[1]);
        BitAssignAccessStream::setNext(dst,2,uVar5 >> 3 & 3);
        BitAssignAccessStream::setNext(dst,iVar3,local_a8[2]);
        BitAssignAccessStream::setNext(dst,2,uVar5 >> 5 & 3);
        uVar12 = uVar12 + 1;
      } while (uVar12 != local_40);
    }
  }
  else if (0 < numValues) {
    uVar12 = (ulong)(uint)numValues;
    paVar13 = (anon_union_1536_2_f6fb8abe_for_value *)((input->value).plain + 1);
    pIVar9 = input;
    do {
      pIVar9 = (ISEInput *)&pIVar9->value;
      paVar6 = (anon_union_1536_2_f6fb8abe_for_value *)pIVar9;
      if (input->isGivenInBlockForm != false) {
        paVar6 = paVar13;
      }
      BitAssignAccessStream::setNext(dst,params->numBits,paVar6->plain[0]);
      paVar13 = (anon_union_1536_2_f6fb8abe_for_value *)(paVar13->plain + 6);
      uVar12 = uVar12 - 1;
    } while (uVar12 != 0);
  }
  return;
}

Assistant:

static void encodeISE (BitAssignAccessStream& dst, const ISEParams& params, const ISEInput& input, int numValues)
{
	if (params.mode == ISEMODE_TRIT)
	{
		const int numBlocks = deDivRoundUp32(numValues, 5);
		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
		{
			const int numValuesInBlock = blockNdx == numBlocks-1 ? numValues - 5*(numBlocks-1) : 5;
			encodeISETritBlock(dst, params.numBits, input.isGivenInBlockForm,
							   input.isGivenInBlockForm ? input.value.block[blockNdx]	: ISEInput::Block(),
							   input.isGivenInBlockForm ? DE_NULL						: &input.value.plain[5*blockNdx],
							   numValuesInBlock);
		}
	}
	else if (params.mode == ISEMODE_QUINT)
	{
		const int numBlocks = deDivRoundUp32(numValues, 3);
		for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
		{
			const int numValuesInBlock = blockNdx == numBlocks-1 ? numValues - 3*(numBlocks-1) : 3;
			encodeISEQuintBlock(dst, params.numBits, input.isGivenInBlockForm,
								input.isGivenInBlockForm ? input.value.block[blockNdx]	: ISEInput::Block(),
								input.isGivenInBlockForm ? DE_NULL						: &input.value.plain[3*blockNdx],
								numValuesInBlock);
		}
	}
	else
	{
		DE_ASSERT(params.mode == ISEMODE_PLAIN_BIT);
		for (int i = 0; i < numValues; i++)
			encodeISEBitBlock(dst, params.numBits, input.isGivenInBlockForm ? input.value.block[i].bitValues[0] : input.value.plain[i]);
	}
}